

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  ZSTD_matchState_t *pZVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  U32 UVar16;
  uint uVar17;
  U32 UVar18;
  uint uVar19;
  U32 UVar20;
  U32 UVar21;
  uint uVar22;
  U32 UVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  BYTE *pBVar27;
  size_t sVar28;
  size_t sVar29;
  U64 UVar30;
  U64 UVar31;
  BYTE *pBVar32;
  BYTE *pBVar33;
  ulong uVar34;
  bool bVar35;
  U32 local_1e84;
  U32 local_1e80;
  BYTE *local_1e18;
  BYTE *local_1e08;
  BYTE *local_1d40;
  BYTE *local_1d30;
  U32 local_1cbc;
  U32 local_1cb8;
  BYTE *local_1c50;
  BYTE *local_1c40;
  BYTE *local_1b78;
  BYTE *local_1b68;
  U32 local_1af4;
  U32 local_1af0;
  BYTE *local_1a88;
  BYTE *local_1a78;
  BYTE *local_19b0;
  BYTE *local_19a0;
  U32 local_192c;
  U32 local_1928;
  BYTE *local_18c0;
  BYTE *local_18b0;
  BYTE *local_17e8;
  BYTE *local_17d8;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 indexToInsert_3;
  BYTE *dictMatchL3_3;
  BYTE *pBStack_16d8;
  U32 dictMatchIndexL3_3;
  BYTE *matchL3_3;
  U32 matchIndexL3_3;
  size_t dictHLNext_3;
  size_t hl3_3;
  BYTE *pBStack_16b0;
  U32 dictMatchIndexS_3;
  BYTE *dictMatchL_3;
  U32 dictMatchIndexL_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_1688;
  U32 repIndex_3;
  BYTE *match_3;
  BYTE *matchLong_3;
  U32 matchIndexS_3;
  U32 matchIndexL_3;
  U32 curr_7;
  size_t dictHS_3;
  size_t dictHL_3;
  size_t h_3;
  size_t h2_3;
  long lStack_1640;
  U32 offset_5;
  size_t mLength_3;
  U32 maxRep_3;
  U32 windowLow_3;
  U32 curr_6;
  U32 dictAndPrefixLength_3;
  U32 dictHBitsS_3;
  U32 dictHBitsL_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashSmall_3;
  U32 *dictHashLong_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 local_15d0;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixLowest_3;
  U32 prefixLowestIndex_3;
  U32 endIndex_3;
  BYTE *anchor_3;
  BYTE *ip_18;
  BYTE *istart_3;
  BYTE *base_3;
  U32 hBitsS_3;
  U32 *hashSmall_3;
  U32 hBitsL_3;
  U32 *hashLong_3;
  ZSTD_compressionParameters *cParams_3;
  size_t local_14d8;
  size_t local_14c0;
  size_t local_14a8;
  size_t local_1430;
  size_t local_1400;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 indexToInsert_2;
  BYTE *dictMatchL3_2;
  BYTE *pBStack_1390;
  U32 dictMatchIndexL3_2;
  BYTE *matchL3_2;
  U32 matchIndexL3_2;
  size_t dictHLNext_2;
  size_t hl3_2;
  BYTE *pBStack_1368;
  U32 dictMatchIndexS_2;
  BYTE *dictMatchL_2;
  U32 dictMatchIndexL_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_1340;
  U32 repIndex_2;
  BYTE *match_2;
  BYTE *matchLong_2;
  U32 matchIndexS_2;
  U32 matchIndexL_2;
  U32 curr_5;
  size_t dictHS_2;
  size_t dictHL_2;
  size_t h_2;
  size_t h2_2;
  long lStack_12f8;
  U32 offset_4;
  size_t mLength_2;
  U32 maxRep_2;
  U32 windowLow_2;
  U32 curr_4;
  U32 dictAndPrefixLength_2;
  U32 dictHBitsS_2;
  U32 dictHBitsL_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashSmall_2;
  U32 *dictHashLong_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 local_1288;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixLowest_2;
  U32 prefixLowestIndex_2;
  U32 endIndex_2;
  BYTE *anchor_2;
  BYTE *ip_12;
  BYTE *istart_2;
  BYTE *base_2;
  U32 hBitsS_2;
  U32 *hashSmall_2;
  U32 hBitsL_2;
  U32 *hashLong_2;
  ZSTD_compressionParameters *cParams_2;
  size_t local_1190;
  size_t local_1178;
  size_t local_1160;
  size_t local_10e8;
  size_t local_10b8;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 indexToInsert_1;
  BYTE *dictMatchL3_1;
  BYTE *pBStack_1048;
  U32 dictMatchIndexL3_1;
  BYTE *matchL3_1;
  U32 matchIndexL3_1;
  size_t dictHLNext_1;
  size_t hl3_1;
  BYTE *pBStack_1020;
  U32 dictMatchIndexS_1;
  BYTE *dictMatchL_1;
  U32 dictMatchIndexL_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_ff8;
  U32 repIndex_1;
  BYTE *match_1;
  BYTE *matchLong_1;
  U32 matchIndexS_1;
  U32 matchIndexL_1;
  U32 curr_3;
  size_t dictHS_1;
  size_t dictHL_1;
  size_t h_1;
  size_t h2_1;
  long lStack_fb0;
  U32 offset_3;
  size_t mLength_1;
  U32 maxRep_1;
  U32 windowLow_1;
  U32 curr_2;
  U32 dictAndPrefixLength_1;
  U32 dictHBitsS_1;
  U32 dictHBitsL_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall_1;
  U32 *dictHashLong_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 local_f40;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest_1;
  U32 prefixLowestIndex_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip_6;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  size_t local_e48;
  size_t local_e30;
  size_t local_e18;
  size_t local_da0;
  size_t local_d70;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  BYTE *pBStack_d00;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  BYTE *pBStack_cd8;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_cb0;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 curr_1;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_c68;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  U32 local_bf8;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  size_t local_b00;
  size_t local_ae8;
  size_t local_ad0;
  size_t local_a58;
  size_t local_a28;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_9;
  BYTE *litLimit_w_9;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_10;
  BYTE *litLimit_w_10;
  BYTE *litEnd_11;
  BYTE *litLimit_w_11;
  BYTE *litEnd_13;
  BYTE *litLimit_w_13;
  BYTE *litEnd_14;
  BYTE *litLimit_w_14;
  BYTE *litEnd_12;
  BYTE *litLimit_w_12;
  BYTE *litEnd_15;
  BYTE *litLimit_w_15;
  BYTE *litEnd_16;
  BYTE *litLimit_w_16;
  BYTE *litEnd_18;
  BYTE *litLimit_w_18;
  BYTE *litEnd_19;
  BYTE *litLimit_w_19;
  BYTE *litEnd_17;
  BYTE *litLimit_w_17;
  BYTE *oend_17;
  BYTE *op_17;
  BYTE *ip_21;
  ptrdiff_t diff_17;
  BYTE *oend_19;
  BYTE *op_19;
  BYTE *ip_23;
  ptrdiff_t diff_19;
  BYTE *oend_18;
  BYTE *op_18;
  BYTE *ip_22;
  ptrdiff_t diff_18;
  BYTE *oend_16;
  BYTE *op_16;
  BYTE *ip_20;
  ptrdiff_t diff_16;
  BYTE *oend_15;
  BYTE *op_15;
  BYTE *ip_19;
  ptrdiff_t diff_15;
  BYTE *oend_12;
  BYTE *op_12;
  BYTE *ip_15;
  ptrdiff_t diff_12;
  BYTE *oend_14;
  BYTE *op_14;
  BYTE *ip_17;
  ptrdiff_t diff_14;
  BYTE *oend_13;
  BYTE *op_13;
  BYTE *ip_16;
  ptrdiff_t diff_13;
  BYTE *oend_11;
  BYTE *op_11;
  BYTE *ip_14;
  ptrdiff_t diff_11;
  BYTE *oend_10;
  BYTE *op_10;
  BYTE *ip_13;
  ptrdiff_t diff_10;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_9;
  BYTE *op_9;
  BYTE *ip_11;
  ptrdiff_t diff_9;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_10;
  ptrdiff_t diff_8;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_5;
  ptrdiff_t diff_4;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  iVar15 = (int)srcSize;
  iVar13 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar14 = (int)pBVar7;
    UVar16 = ZSTD_getLowestPrefixIndex(ms,(iVar13 - iVar14) + iVar15,(ms->cParams).windowLog);
    pBVar24 = pBVar7 + UVar16;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved = *rep;
    local_bf8 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar17 = UVar16 - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    anchor = (BYTE *)((long)src +
                     (long)(int)(uint)((iVar13 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27) == 0)
                     );
    _prefixLowestIndex = (BYTE *)src;
LAB_00aae3d2:
    if (anchor < pBVar26) {
      sVar29 = ZSTD_hash8Ptr(anchor,UVar1);
      switch(0xaae523) {
      case 0:
        local_a28 = ZSTD_hash4Ptr(anchor,UVar2);
        break;
      case 1:
        local_a28 = ZSTD_hash5Ptr(anchor,UVar2);
        break;
      case 2:
        local_a28 = ZSTD_hash6Ptr(anchor,UVar2);
        break;
      case 3:
        local_a28 = ZSTD_hash7Ptr(anchor,UVar2);
        break;
      case 4:
        local_a28 = ZSTD_hash8Ptr(anchor,UVar2);
      }
      sVar28 = ZSTD_hash8Ptr(anchor,UVar3);
      switch(0xaae6f3) {
      case 0:
        local_a58 = ZSTD_hash4Ptr(anchor,UVar4);
        break;
      case 1:
        local_a58 = ZSTD_hash5Ptr(anchor,UVar4);
        break;
      case 2:
        local_a58 = ZSTD_hash6Ptr(anchor,UVar4);
        break;
      case 3:
        local_a58 = ZSTD_hash7Ptr(anchor,UVar4);
        break;
      case 4:
        local_a58 = ZSTD_hash8Ptr(anchor,UVar4);
      }
      iVar15 = (int)anchor;
      UVar18 = iVar15 - iVar14;
      uVar22 = pUVar5[sVar29];
      matchLong._4_4_ = pUVar6[local_a28];
      match = pBVar7 + uVar22;
      pBStack_cb0 = pBVar7 + matchLong._4_4_;
      uVar19 = (UVar18 + 1) - offsetSaved;
      if (uVar19 < UVar16) {
        local_17d8 = pBVar11 + (uVar19 - uVar17);
      }
      else {
        local_17d8 = pBVar7 + uVar19;
      }
      pUVar6[local_a28] = UVar18;
      pUVar5[sVar29] = UVar18;
      if ((UVar16 - 1) - uVar19 < 3) {
LAB_00aaf06a:
        if (UVar16 < uVar22) {
          UVar30 = MEM_read64(match);
          UVar31 = MEM_read64(anchor);
          if (UVar30 != UVar31) goto LAB_00aaf31f;
          sVar29 = ZSTD_count(anchor + 8,match + 8,pBVar25);
          lStack_c68 = sVar29 + 8;
          h2._4_4_ = iVar15 - (int)match;
          while( true ) {
            bVar35 = false;
            if (_prefixLowestIndex < anchor && pBVar24 < match) {
              bVar35 = anchor[-1] == match[-1];
            }
            if (!bVar35) break;
            anchor = anchor + -1;
            match = match + -1;
            lStack_c68 = lStack_c68 + 1;
          }
          goto LAB_00aafb19;
        }
        uVar22 = pUVar9[sVar28];
        pBStack_cd8 = pBVar11 + uVar22;
        if (pBVar27 < pBStack_cd8) {
          UVar30 = MEM_read64(pBStack_cd8);
          UVar31 = MEM_read64(anchor);
          if (UVar30 == UVar31) {
            sVar29 = ZSTD_count_2segments(anchor + 8,pBStack_cd8 + 8,pBVar25,pBVar12,pBVar24);
            lStack_c68 = sVar29 + 8;
            h2._4_4_ = (UVar18 - uVar22) - uVar17;
            while( true ) {
              bVar35 = false;
              if (_prefixLowestIndex < anchor && pBVar27 < pBStack_cd8) {
                bVar35 = anchor[-1] == pBStack_cd8[-1];
              }
              if (!bVar35) break;
              anchor = anchor + -1;
              pBStack_cd8 = pBStack_cd8 + -1;
              lStack_c68 = lStack_c68 + 1;
            }
            goto LAB_00aafb19;
          }
        }
LAB_00aaf31f:
        if (UVar16 < matchLong._4_4_) {
          UVar20 = MEM_read32(pBStack_cb0);
          UVar21 = MEM_read32(anchor);
          if (UVar20 == UVar21) {
LAB_00aaf416:
            sVar29 = ZSTD_hash8Ptr(anchor + 1,UVar1);
            sVar28 = ZSTD_hash8Ptr(anchor + 1,UVar3);
            uVar22 = pUVar5[sVar29];
            pBStack_d00 = pBVar7 + uVar22;
            pUVar5[sVar29] = UVar18 + 1;
            if (UVar16 < uVar22) {
              UVar30 = MEM_read64(pBStack_d00);
              UVar31 = MEM_read64(anchor + 1);
              if (UVar30 != UVar31) goto code_r0x00aaf927;
              sVar29 = ZSTD_count(anchor + 9,pBStack_d00 + 8,pBVar25);
              lStack_c68 = sVar29 + 8;
              anchor = anchor + 1;
              h2._4_4_ = (int)anchor - (int)pBStack_d00;
              while( true ) {
                bVar35 = false;
                if (_prefixLowestIndex < anchor && pBVar24 < pBStack_d00) {
                  bVar35 = anchor[-1] == pBStack_d00[-1];
                }
                if (!bVar35) break;
                anchor = anchor + -1;
                pBStack_d00 = pBStack_d00 + -1;
                lStack_c68 = lStack_c68 + 1;
              }
            }
            else {
              uVar22 = pUVar9[sVar28];
              _current2 = pBVar11 + uVar22;
              if (pBVar27 < _current2) {
                UVar30 = MEM_read64(_current2);
                UVar31 = MEM_read64(anchor + 1);
                if (UVar30 == UVar31) {
                  sVar29 = ZSTD_count_2segments(anchor + 9,_current2 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_c68 = sVar29 + 8;
                  anchor = anchor + 1;
                  h2._4_4_ = ((UVar18 + 1) - uVar22) - uVar17;
                  while( true ) {
                    bVar35 = false;
                    if (_prefixLowestIndex < anchor && pBVar27 < _current2) {
                      bVar35 = anchor[-1] == _current2[-1];
                    }
                    if (!bVar35) break;
                    anchor = anchor + -1;
                    _current2 = _current2 + -1;
                    lStack_c68 = lStack_c68 + 1;
                  }
                  goto LAB_00aafb19;
                }
              }
code_r0x00aaf927:
              if (matchLong._4_4_ < UVar16) {
                sVar29 = ZSTD_count_2segments(anchor + 4,pBStack_cb0 + 4,pBVar25,pBVar12,pBVar24);
                lStack_c68 = sVar29 + 4;
                h2._4_4_ = UVar18 - matchLong._4_4_;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex < anchor && pBVar27 < pBStack_cb0) {
                    bVar35 = anchor[-1] == pBStack_cb0[-1];
                  }
                  if (!bVar35) break;
                  anchor = anchor + -1;
                  pBStack_cb0 = pBStack_cb0 + -1;
                  lStack_c68 = lStack_c68 + 1;
                }
              }
              else {
                sVar29 = ZSTD_count(anchor + 4,pBStack_cb0 + 4,pBVar25);
                lStack_c68 = sVar29 + 4;
                h2._4_4_ = iVar15 - (int)pBStack_cb0;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex < anchor && pBVar24 < pBStack_cb0) {
                    bVar35 = anchor[-1] == pBStack_cb0[-1];
                  }
                  if (!bVar35) break;
                  anchor = anchor + -1;
                  pBStack_cb0 = pBStack_cb0 + -1;
                  lStack_c68 = lStack_c68 + 1;
                }
              }
            }
LAB_00aafb19:
            local_bf8 = offsetSaved;
            offsetSaved = h2._4_4_;
            uVar34 = (long)anchor - (long)_prefixLowestIndex;
            if (pBVar25 + -0x20 < _prefixLowestIndex + uVar34) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_prefixLowestIndex,_prefixLowestIndex + uVar34,
                         pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_prefixLowestIndex);
              if (0x10 < uVar34) {
                pBVar33 = seqStore->lit;
                pBVar32 = pBVar33 + 0x10;
                ZSTD_copy16(pBVar32,_prefixLowestIndex + 0x10);
                if (0x10 < (long)(uVar34 - 0x10)) {
                  oend_2 = pBVar33 + 0x20;
                  do {
                    op_2 = _prefixLowestIndex + 0x20;
                    ZSTD_copy16(oend_2,op_2);
                    ZSTD_copy16(oend_2 + 0x10,_prefixLowestIndex + 0x30);
                    oend_2 = oend_2 + 0x20;
                    _prefixLowestIndex = op_2;
                  } while (oend_2 < pBVar32 + (uVar34 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar34;
            seqStore->sequences->offset = h2._4_4_ + 3;
            if (0xffff < lStack_c68 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_c68 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_00aafecc;
          }
        }
        else {
          pBStack_cb0 = pBVar11 + pUVar10[local_a58];
          matchLong._4_4_ = pUVar10[local_a58] + uVar17;
          if (pBVar27 < pBStack_cb0) {
            UVar20 = MEM_read32(pBStack_cb0);
            UVar21 = MEM_read32(anchor);
            if (UVar20 == UVar21) goto LAB_00aaf416;
          }
        }
        anchor = anchor + ((long)anchor - (long)_prefixLowestIndex >> 8) + 1;
      }
      else {
        UVar20 = MEM_read32(local_17d8);
        UVar21 = MEM_read32(anchor + 1);
        if (UVar20 != UVar21) goto LAB_00aaf06a;
        local_17e8 = pBVar25;
        if (uVar19 < UVar16) {
          local_17e8 = pBVar12;
        }
        sVar29 = ZSTD_count_2segments(anchor + 5,local_17d8 + 4,pBVar25,local_17e8,pBVar24);
        lStack_c68 = sVar29 + 4;
        anchor = anchor + 1;
        uVar34 = (long)anchor - (long)_prefixLowestIndex;
        if (pBVar25 + -0x20 < _prefixLowestIndex + uVar34) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex,_prefixLowestIndex + uVar34,pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex);
          if (0x10 < uVar34) {
            pBVar33 = seqStore->lit;
            pBVar32 = pBVar33 + 0x10;
            ZSTD_copy16(pBVar32,_prefixLowestIndex + 0x10);
            if (0x10 < (long)(uVar34 - 0x10)) {
              oend = pBVar33 + 0x20;
              do {
                op = _prefixLowestIndex + 0x20;
                ZSTD_copy16(oend,op);
                ZSTD_copy16(oend + 0x10,_prefixLowestIndex + 0x30);
                oend = oend + 0x20;
                _prefixLowestIndex = op;
              } while (oend < pBVar32 + (uVar34 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar34;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00aafecc:
        _prefixLowestIndex = anchor + lStack_c68;
        anchor = _prefixLowestIndex;
        if (_prefixLowestIndex <= pBVar26) {
          uVar22 = UVar18 + 2;
          sVar29 = ZSTD_hash8Ptr(pBVar7 + uVar22,UVar1);
          pUVar5[sVar29] = uVar22;
          sVar29 = ZSTD_hash8Ptr(_prefixLowestIndex + -2,UVar1);
          pUVar5[sVar29] = (int)(_prefixLowestIndex + -2) - iVar14;
          pBVar33 = pBVar7 + uVar22;
          switch(0xab01a8) {
          case 0:
            local_ad0 = ZSTD_hash4Ptr(pBVar33,UVar2);
            break;
          case 1:
            local_ad0 = ZSTD_hash5Ptr(pBVar33,UVar2);
            break;
          case 2:
            local_ad0 = ZSTD_hash6Ptr(pBVar33,UVar2);
            break;
          case 3:
            local_ad0 = ZSTD_hash7Ptr(pBVar33,UVar2);
            break;
          case 4:
            local_ad0 = ZSTD_hash8Ptr(pBVar33,UVar2);
          }
          pUVar6[local_ad0] = uVar22;
          _prefixLowestIndex = _prefixLowestIndex + -1;
          switch(0xab02bb) {
          case 0:
            local_ae8 = ZSTD_hash4Ptr(_prefixLowestIndex,UVar2);
            break;
          case 1:
            local_ae8 = ZSTD_hash5Ptr(_prefixLowestIndex,UVar2);
            break;
          case 2:
            local_ae8 = ZSTD_hash6Ptr(_prefixLowestIndex,UVar2);
            break;
          case 3:
            local_ae8 = ZSTD_hash7Ptr(_prefixLowestIndex,UVar2);
            break;
          case 4:
            local_ae8 = ZSTD_hash8Ptr(_prefixLowestIndex,UVar2);
          }
          pUVar6[local_ae8] = (int)_prefixLowestIndex - iVar14;
          for (; UVar18 = local_bf8, _prefixLowestIndex = anchor, anchor <= pBVar26;
              anchor = anchor + sVar29 + 4) {
            UVar20 = (int)anchor - iVar14;
            uVar22 = UVar20 - local_bf8;
            if (uVar22 < UVar16) {
              local_18b0 = pBVar11 + ((ulong)uVar22 - (ulong)uVar17);
            }
            else {
              local_18b0 = pBVar7 + uVar22;
            }
            if ((UVar16 - 1) - uVar22 < 3) break;
            UVar21 = MEM_read32(local_18b0);
            UVar23 = MEM_read32(anchor);
            if (UVar21 != UVar23) break;
            local_18c0 = pBVar25;
            if (uVar22 < UVar16) {
              local_18c0 = pBVar12;
            }
            sVar29 = ZSTD_count_2segments(anchor + 4,local_18b0 + 4,pBVar25,local_18c0,pBVar24);
            local_bf8 = offsetSaved;
            offsetSaved = UVar18;
            if (pBVar25 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_3._0_2_ = (U16)(sVar29 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_3;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0xab08dd) {
            case 0:
              local_b00 = ZSTD_hash4Ptr(anchor,UVar2);
              break;
            case 1:
              local_b00 = ZSTD_hash5Ptr(anchor,UVar2);
              break;
            case 2:
              local_b00 = ZSTD_hash6Ptr(anchor,UVar2);
              break;
            case 3:
              local_b00 = ZSTD_hash7Ptr(anchor,UVar2);
              break;
            case 4:
              local_b00 = ZSTD_hash8Ptr(anchor,UVar2);
            }
            pUVar6[local_b00] = UVar20;
            sVar28 = ZSTD_hash8Ptr(anchor,UVar1);
            pUVar5[sVar28] = UVar20;
          }
        }
      }
      goto LAB_00aae3d2;
    }
    if (offsetSaved == 0) {
      local_1928 = 0;
    }
    else {
      local_1928 = offsetSaved;
    }
    *rep = local_1928;
    if (local_bf8 == 0) {
      local_192c = 0;
    }
    else {
      local_192c = local_bf8;
    }
    rep[1] = local_192c;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_prefixLowestIndex);
    break;
  case 5:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar14 = (int)pBVar7;
    UVar16 = ZSTD_getLowestPrefixIndex(ms,(iVar13 - iVar14) + iVar15,(ms->cParams).windowLog);
    pBVar24 = pBVar7 + UVar16;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_1 = *rep;
    local_f40 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar17 = UVar16 - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    anchor_1 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar13 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27) ==
                                        0));
    _prefixLowestIndex_1 = (BYTE *)src;
LAB_00ab16cc:
    if (anchor_1 < pBVar26) {
      sVar29 = ZSTD_hash8Ptr(anchor_1,UVar1);
      switch(0xab1838) {
      case 0:
        local_d70 = ZSTD_hash4Ptr(anchor_1,UVar2);
        break;
      case 1:
        local_d70 = ZSTD_hash5Ptr(anchor_1,UVar2);
        break;
      case 2:
        local_d70 = ZSTD_hash6Ptr(anchor_1,UVar2);
        break;
      case 3:
        local_d70 = ZSTD_hash7Ptr(anchor_1,UVar2);
        break;
      case 4:
        local_d70 = ZSTD_hash8Ptr(anchor_1,UVar2);
      }
      sVar28 = ZSTD_hash8Ptr(anchor_1,UVar3);
      switch(0xab1a08) {
      case 0:
        local_da0 = ZSTD_hash4Ptr(anchor_1,UVar4);
        break;
      case 1:
        local_da0 = ZSTD_hash5Ptr(anchor_1,UVar4);
        break;
      case 2:
        local_da0 = ZSTD_hash6Ptr(anchor_1,UVar4);
        break;
      case 3:
        local_da0 = ZSTD_hash7Ptr(anchor_1,UVar4);
        break;
      case 4:
        local_da0 = ZSTD_hash8Ptr(anchor_1,UVar4);
      }
      iVar15 = (int)anchor_1;
      UVar18 = iVar15 - iVar14;
      uVar22 = pUVar5[sVar29];
      matchLong_1._4_4_ = pUVar6[local_d70];
      match_1 = pBVar7 + uVar22;
      pBStack_ff8 = pBVar7 + matchLong_1._4_4_;
      uVar19 = (UVar18 + 1) - offsetSaved_1;
      if (uVar19 < UVar16) {
        local_19a0 = pBVar11 + (uVar19 - uVar17);
      }
      else {
        local_19a0 = pBVar7 + uVar19;
      }
      pUVar6[local_d70] = UVar18;
      pUVar5[sVar29] = UVar18;
      if ((UVar16 - 1) - uVar19 < 3) {
LAB_00ab2478:
        if (UVar16 < uVar22) {
          UVar30 = MEM_read64(match_1);
          UVar31 = MEM_read64(anchor_1);
          if (UVar30 != UVar31) goto LAB_00ab272d;
          sVar29 = ZSTD_count(anchor_1 + 8,match_1 + 8,pBVar25);
          lStack_fb0 = sVar29 + 8;
          h2_1._4_4_ = iVar15 - (int)match_1;
          while( true ) {
            bVar35 = false;
            if (_prefixLowestIndex_1 < anchor_1 && pBVar24 < match_1) {
              bVar35 = anchor_1[-1] == match_1[-1];
            }
            if (!bVar35) break;
            anchor_1 = anchor_1 + -1;
            match_1 = match_1 + -1;
            lStack_fb0 = lStack_fb0 + 1;
          }
          goto LAB_00ab2f27;
        }
        uVar22 = pUVar9[sVar28];
        pBStack_1020 = pBVar11 + uVar22;
        if (pBVar27 < pBStack_1020) {
          UVar30 = MEM_read64(pBStack_1020);
          UVar31 = MEM_read64(anchor_1);
          if (UVar30 == UVar31) {
            sVar29 = ZSTD_count_2segments(anchor_1 + 8,pBStack_1020 + 8,pBVar25,pBVar12,pBVar24);
            lStack_fb0 = sVar29 + 8;
            h2_1._4_4_ = (UVar18 - uVar22) - uVar17;
            while( true ) {
              bVar35 = false;
              if (_prefixLowestIndex_1 < anchor_1 && pBVar27 < pBStack_1020) {
                bVar35 = anchor_1[-1] == pBStack_1020[-1];
              }
              if (!bVar35) break;
              anchor_1 = anchor_1 + -1;
              pBStack_1020 = pBStack_1020 + -1;
              lStack_fb0 = lStack_fb0 + 1;
            }
            goto LAB_00ab2f27;
          }
        }
LAB_00ab272d:
        if (UVar16 < matchLong_1._4_4_) {
          UVar20 = MEM_read32(pBStack_ff8);
          UVar21 = MEM_read32(anchor_1);
          if (UVar20 == UVar21) {
LAB_00ab2824:
            sVar29 = ZSTD_hash8Ptr(anchor_1 + 1,UVar1);
            sVar28 = ZSTD_hash8Ptr(anchor_1 + 1,UVar3);
            uVar22 = pUVar5[sVar29];
            pBStack_1048 = pBVar7 + uVar22;
            pUVar5[sVar29] = UVar18 + 1;
            if (UVar16 < uVar22) {
              UVar30 = MEM_read64(pBStack_1048);
              UVar31 = MEM_read64(anchor_1 + 1);
              if (UVar30 != UVar31) goto code_r0x00ab2d35;
              sVar29 = ZSTD_count(anchor_1 + 9,pBStack_1048 + 8,pBVar25);
              lStack_fb0 = sVar29 + 8;
              anchor_1 = anchor_1 + 1;
              h2_1._4_4_ = (int)anchor_1 - (int)pBStack_1048;
              while( true ) {
                bVar35 = false;
                if (_prefixLowestIndex_1 < anchor_1 && pBVar24 < pBStack_1048) {
                  bVar35 = anchor_1[-1] == pBStack_1048[-1];
                }
                if (!bVar35) break;
                anchor_1 = anchor_1 + -1;
                pBStack_1048 = pBStack_1048 + -1;
                lStack_fb0 = lStack_fb0 + 1;
              }
            }
            else {
              uVar22 = pUVar9[sVar28];
              _current2_1 = pBVar11 + uVar22;
              if (pBVar27 < _current2_1) {
                UVar30 = MEM_read64(_current2_1);
                UVar31 = MEM_read64(anchor_1 + 1);
                if (UVar30 == UVar31) {
                  sVar29 = ZSTD_count_2segments
                                     (anchor_1 + 9,_current2_1 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_fb0 = sVar29 + 8;
                  anchor_1 = anchor_1 + 1;
                  h2_1._4_4_ = ((UVar18 + 1) - uVar22) - uVar17;
                  while( true ) {
                    bVar35 = false;
                    if (_prefixLowestIndex_1 < anchor_1 && pBVar27 < _current2_1) {
                      bVar35 = anchor_1[-1] == _current2_1[-1];
                    }
                    if (!bVar35) break;
                    anchor_1 = anchor_1 + -1;
                    _current2_1 = _current2_1 + -1;
                    lStack_fb0 = lStack_fb0 + 1;
                  }
                  goto LAB_00ab2f27;
                }
              }
code_r0x00ab2d35:
              if (matchLong_1._4_4_ < UVar16) {
                sVar29 = ZSTD_count_2segments(anchor_1 + 4,pBStack_ff8 + 4,pBVar25,pBVar12,pBVar24);
                lStack_fb0 = sVar29 + 4;
                h2_1._4_4_ = UVar18 - matchLong_1._4_4_;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex_1 < anchor_1 && pBVar27 < pBStack_ff8) {
                    bVar35 = anchor_1[-1] == pBStack_ff8[-1];
                  }
                  if (!bVar35) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_ff8 = pBStack_ff8 + -1;
                  lStack_fb0 = lStack_fb0 + 1;
                }
              }
              else {
                sVar29 = ZSTD_count(anchor_1 + 4,pBStack_ff8 + 4,pBVar25);
                lStack_fb0 = sVar29 + 4;
                h2_1._4_4_ = iVar15 - (int)pBStack_ff8;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex_1 < anchor_1 && pBVar24 < pBStack_ff8) {
                    bVar35 = anchor_1[-1] == pBStack_ff8[-1];
                  }
                  if (!bVar35) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_ff8 = pBStack_ff8 + -1;
                  lStack_fb0 = lStack_fb0 + 1;
                }
              }
            }
LAB_00ab2f27:
            local_f40 = offsetSaved_1;
            offsetSaved_1 = h2_1._4_4_;
            uVar34 = (long)anchor_1 - (long)_prefixLowestIndex_1;
            if (pBVar25 + -0x20 < _prefixLowestIndex_1 + uVar34) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_prefixLowestIndex_1,_prefixLowestIndex_1 + uVar34,
                         pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_prefixLowestIndex_1);
              if (0x10 < uVar34) {
                pBVar33 = seqStore->lit;
                pBVar32 = pBVar33 + 0x10;
                ZSTD_copy16(pBVar32,_prefixLowestIndex_1 + 0x10);
                if (0x10 < (long)(uVar34 - 0x10)) {
                  oend_7 = pBVar33 + 0x20;
                  do {
                    op_7 = _prefixLowestIndex_1 + 0x20;
                    ZSTD_copy16(oend_7,op_7);
                    ZSTD_copy16(oend_7 + 0x10,_prefixLowestIndex_1 + 0x30);
                    oend_7 = oend_7 + 0x20;
                    _prefixLowestIndex_1 = op_7;
                  } while (oend_7 < pBVar32 + (uVar34 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar34;
            seqStore->sequences->offset = h2_1._4_4_ + 3;
            if (0xffff < lStack_fb0 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_fb0 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_00ab32da;
          }
        }
        else {
          pBStack_ff8 = pBVar11 + pUVar10[local_da0];
          matchLong_1._4_4_ = pUVar10[local_da0] + uVar17;
          if (pBVar27 < pBStack_ff8) {
            UVar20 = MEM_read32(pBStack_ff8);
            UVar21 = MEM_read32(anchor_1);
            if (UVar20 == UVar21) goto LAB_00ab2824;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)_prefixLowestIndex_1 >> 8) + 1;
      }
      else {
        UVar20 = MEM_read32(local_19a0);
        UVar21 = MEM_read32(anchor_1 + 1);
        if (UVar20 != UVar21) goto LAB_00ab2478;
        local_19b0 = pBVar25;
        if (uVar19 < UVar16) {
          local_19b0 = pBVar12;
        }
        sVar29 = ZSTD_count_2segments(anchor_1 + 5,local_19a0 + 4,pBVar25,local_19b0,pBVar24);
        lStack_fb0 = sVar29 + 4;
        anchor_1 = anchor_1 + 1;
        uVar34 = (long)anchor_1 - (long)_prefixLowestIndex_1;
        if (pBVar25 + -0x20 < _prefixLowestIndex_1 + uVar34) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_1,_prefixLowestIndex_1 + uVar34,
                     pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_1);
          if (0x10 < uVar34) {
            pBVar33 = seqStore->lit;
            pBVar32 = pBVar33 + 0x10;
            ZSTD_copy16(pBVar32,_prefixLowestIndex_1 + 0x10);
            if (0x10 < (long)(uVar34 - 0x10)) {
              oend_5 = pBVar33 + 0x20;
              do {
                op_5 = _prefixLowestIndex_1 + 0x20;
                ZSTD_copy16(oend_5,op_5);
                ZSTD_copy16(oend_5 + 0x10,_prefixLowestIndex_1 + 0x30);
                oend_5 = oend_5 + 0x20;
                _prefixLowestIndex_1 = op_5;
              } while (oend_5 < pBVar32 + (uVar34 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar34;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00ab32da:
        _prefixLowestIndex_1 = anchor_1 + lStack_fb0;
        anchor_1 = _prefixLowestIndex_1;
        if (_prefixLowestIndex_1 <= pBVar26) {
          uVar22 = UVar18 + 2;
          sVar29 = ZSTD_hash8Ptr(pBVar7 + uVar22,UVar1);
          pUVar5[sVar29] = uVar22;
          sVar29 = ZSTD_hash8Ptr(_prefixLowestIndex_1 + -2,UVar1);
          pUVar5[sVar29] = (int)(_prefixLowestIndex_1 + -2) - iVar14;
          pBVar33 = pBVar7 + uVar22;
          switch(0xab35d1) {
          case 0:
            local_e18 = ZSTD_hash4Ptr(pBVar33,UVar2);
            break;
          case 1:
            local_e18 = ZSTD_hash5Ptr(pBVar33,UVar2);
            break;
          case 2:
            local_e18 = ZSTD_hash6Ptr(pBVar33,UVar2);
            break;
          case 3:
            local_e18 = ZSTD_hash7Ptr(pBVar33,UVar2);
            break;
          case 4:
            local_e18 = ZSTD_hash8Ptr(pBVar33,UVar2);
          }
          pUVar6[local_e18] = uVar22;
          _prefixLowestIndex_1 = _prefixLowestIndex_1 + -1;
          switch(0xab36e4) {
          case 0:
            local_e30 = ZSTD_hash4Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 1:
            local_e30 = ZSTD_hash5Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 2:
            local_e30 = ZSTD_hash6Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 3:
            local_e30 = ZSTD_hash7Ptr(_prefixLowestIndex_1,UVar2);
            break;
          case 4:
            local_e30 = ZSTD_hash8Ptr(_prefixLowestIndex_1,UVar2);
          }
          pUVar6[local_e30] = (int)_prefixLowestIndex_1 - iVar14;
          for (; UVar18 = local_f40, _prefixLowestIndex_1 = anchor_1, anchor_1 <= pBVar26;
              anchor_1 = anchor_1 + sVar29 + 4) {
            UVar20 = (int)anchor_1 - iVar14;
            uVar22 = UVar20 - local_f40;
            if (uVar22 < UVar16) {
              local_1a78 = pBVar11 + ((ulong)uVar22 - (ulong)uVar17);
            }
            else {
              local_1a78 = pBVar7 + uVar22;
            }
            if ((UVar16 - 1) - uVar22 < 3) break;
            UVar21 = MEM_read32(local_1a78);
            UVar23 = MEM_read32(anchor_1);
            if (UVar21 != UVar23) break;
            local_1a88 = pBVar25;
            if (uVar22 < UVar16) {
              local_1a88 = pBVar12;
            }
            sVar29 = ZSTD_count_2segments(anchor_1 + 4,local_1a78 + 4,pBVar25,local_1a88,pBVar24);
            local_f40 = offsetSaved_1;
            offsetSaved_1 = UVar18;
            if (pBVar25 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_8._0_2_ = (U16)(sVar29 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_8;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0xab3d06) {
            case 0:
              local_e48 = ZSTD_hash4Ptr(anchor_1,UVar2);
              break;
            case 1:
              local_e48 = ZSTD_hash5Ptr(anchor_1,UVar2);
              break;
            case 2:
              local_e48 = ZSTD_hash6Ptr(anchor_1,UVar2);
              break;
            case 3:
              local_e48 = ZSTD_hash7Ptr(anchor_1,UVar2);
              break;
            case 4:
              local_e48 = ZSTD_hash8Ptr(anchor_1,UVar2);
            }
            pUVar6[local_e48] = UVar20;
            sVar28 = ZSTD_hash8Ptr(anchor_1,UVar1);
            pUVar5[sVar28] = UVar20;
          }
        }
      }
      goto LAB_00ab16cc;
    }
    if (offsetSaved_1 == 0) {
      local_1af0 = 0;
    }
    else {
      local_1af0 = offsetSaved_1;
    }
    *rep = local_1af0;
    if (local_f40 == 0) {
      local_1af4 = 0;
    }
    else {
      local_1af4 = local_f40;
    }
    rep[1] = local_1af4;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_prefixLowestIndex_1);
    break;
  case 6:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar14 = (int)pBVar7;
    UVar16 = ZSTD_getLowestPrefixIndex(ms,(iVar13 - iVar14) + iVar15,(ms->cParams).windowLog);
    pBVar24 = pBVar7 + UVar16;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_2 = *rep;
    local_1288 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar17 = UVar16 - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    anchor_2 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar13 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27) ==
                                        0));
    _prefixLowestIndex_2 = (BYTE *)src;
LAB_00ab4ada:
    if (anchor_2 < pBVar26) {
      sVar29 = ZSTD_hash8Ptr(anchor_2,UVar1);
      switch(0xab4c61) {
      case 0:
        local_10b8 = ZSTD_hash4Ptr(anchor_2,UVar2);
        break;
      case 1:
        local_10b8 = ZSTD_hash5Ptr(anchor_2,UVar2);
        break;
      case 2:
        local_10b8 = ZSTD_hash6Ptr(anchor_2,UVar2);
        break;
      case 3:
        local_10b8 = ZSTD_hash7Ptr(anchor_2,UVar2);
        break;
      case 4:
        local_10b8 = ZSTD_hash8Ptr(anchor_2,UVar2);
      }
      sVar28 = ZSTD_hash8Ptr(anchor_2,UVar3);
      switch(0xab4e31) {
      case 0:
        local_10e8 = ZSTD_hash4Ptr(anchor_2,UVar4);
        break;
      case 1:
        local_10e8 = ZSTD_hash5Ptr(anchor_2,UVar4);
        break;
      case 2:
        local_10e8 = ZSTD_hash6Ptr(anchor_2,UVar4);
        break;
      case 3:
        local_10e8 = ZSTD_hash7Ptr(anchor_2,UVar4);
        break;
      case 4:
        local_10e8 = ZSTD_hash8Ptr(anchor_2,UVar4);
      }
      iVar15 = (int)anchor_2;
      UVar18 = iVar15 - iVar14;
      uVar22 = pUVar5[sVar29];
      matchLong_2._4_4_ = pUVar6[local_10b8];
      match_2 = pBVar7 + uVar22;
      pBStack_1340 = pBVar7 + matchLong_2._4_4_;
      uVar19 = (UVar18 + 1) - offsetSaved_2;
      if (uVar19 < UVar16) {
        local_1b68 = pBVar11 + (uVar19 - uVar17);
      }
      else {
        local_1b68 = pBVar7 + uVar19;
      }
      pUVar6[local_10b8] = UVar18;
      pUVar5[sVar29] = UVar18;
      if ((UVar16 - 1) - uVar19 < 3) {
LAB_00ab5886:
        if (UVar16 < uVar22) {
          UVar30 = MEM_read64(match_2);
          UVar31 = MEM_read64(anchor_2);
          if (UVar30 != UVar31) goto LAB_00ab5b3b;
          sVar29 = ZSTD_count(anchor_2 + 8,match_2 + 8,pBVar25);
          lStack_12f8 = sVar29 + 8;
          h2_2._4_4_ = iVar15 - (int)match_2;
          while( true ) {
            bVar35 = false;
            if (_prefixLowestIndex_2 < anchor_2 && pBVar24 < match_2) {
              bVar35 = anchor_2[-1] == match_2[-1];
            }
            if (!bVar35) break;
            anchor_2 = anchor_2 + -1;
            match_2 = match_2 + -1;
            lStack_12f8 = lStack_12f8 + 1;
          }
          goto LAB_00ab6335;
        }
        uVar22 = pUVar9[sVar28];
        pBStack_1368 = pBVar11 + uVar22;
        if (pBVar27 < pBStack_1368) {
          UVar30 = MEM_read64(pBStack_1368);
          UVar31 = MEM_read64(anchor_2);
          if (UVar30 == UVar31) {
            sVar29 = ZSTD_count_2segments(anchor_2 + 8,pBStack_1368 + 8,pBVar25,pBVar12,pBVar24);
            lStack_12f8 = sVar29 + 8;
            h2_2._4_4_ = (UVar18 - uVar22) - uVar17;
            while( true ) {
              bVar35 = false;
              if (_prefixLowestIndex_2 < anchor_2 && pBVar27 < pBStack_1368) {
                bVar35 = anchor_2[-1] == pBStack_1368[-1];
              }
              if (!bVar35) break;
              anchor_2 = anchor_2 + -1;
              pBStack_1368 = pBStack_1368 + -1;
              lStack_12f8 = lStack_12f8 + 1;
            }
            goto LAB_00ab6335;
          }
        }
LAB_00ab5b3b:
        if (UVar16 < matchLong_2._4_4_) {
          UVar20 = MEM_read32(pBStack_1340);
          UVar21 = MEM_read32(anchor_2);
          if (UVar20 == UVar21) {
LAB_00ab5c32:
            sVar29 = ZSTD_hash8Ptr(anchor_2 + 1,UVar1);
            sVar28 = ZSTD_hash8Ptr(anchor_2 + 1,UVar3);
            uVar22 = pUVar5[sVar29];
            pBStack_1390 = pBVar7 + uVar22;
            pUVar5[sVar29] = UVar18 + 1;
            if (UVar16 < uVar22) {
              UVar30 = MEM_read64(pBStack_1390);
              UVar31 = MEM_read64(anchor_2 + 1);
              if (UVar30 != UVar31) goto code_r0x00ab6143;
              sVar29 = ZSTD_count(anchor_2 + 9,pBStack_1390 + 8,pBVar25);
              lStack_12f8 = sVar29 + 8;
              anchor_2 = anchor_2 + 1;
              h2_2._4_4_ = (int)anchor_2 - (int)pBStack_1390;
              while( true ) {
                bVar35 = false;
                if (_prefixLowestIndex_2 < anchor_2 && pBVar24 < pBStack_1390) {
                  bVar35 = anchor_2[-1] == pBStack_1390[-1];
                }
                if (!bVar35) break;
                anchor_2 = anchor_2 + -1;
                pBStack_1390 = pBStack_1390 + -1;
                lStack_12f8 = lStack_12f8 + 1;
              }
            }
            else {
              uVar22 = pUVar9[sVar28];
              _current2_2 = pBVar11 + uVar22;
              if (pBVar27 < _current2_2) {
                UVar30 = MEM_read64(_current2_2);
                UVar31 = MEM_read64(anchor_2 + 1);
                if (UVar30 == UVar31) {
                  sVar29 = ZSTD_count_2segments
                                     (anchor_2 + 9,_current2_2 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_12f8 = sVar29 + 8;
                  anchor_2 = anchor_2 + 1;
                  h2_2._4_4_ = ((UVar18 + 1) - uVar22) - uVar17;
                  while( true ) {
                    bVar35 = false;
                    if (_prefixLowestIndex_2 < anchor_2 && pBVar27 < _current2_2) {
                      bVar35 = anchor_2[-1] == _current2_2[-1];
                    }
                    if (!bVar35) break;
                    anchor_2 = anchor_2 + -1;
                    _current2_2 = _current2_2 + -1;
                    lStack_12f8 = lStack_12f8 + 1;
                  }
                  goto LAB_00ab6335;
                }
              }
code_r0x00ab6143:
              if (matchLong_2._4_4_ < UVar16) {
                sVar29 = ZSTD_count_2segments(anchor_2 + 4,pBStack_1340 + 4,pBVar25,pBVar12,pBVar24)
                ;
                lStack_12f8 = sVar29 + 4;
                h2_2._4_4_ = UVar18 - matchLong_2._4_4_;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex_2 < anchor_2 && pBVar27 < pBStack_1340) {
                    bVar35 = anchor_2[-1] == pBStack_1340[-1];
                  }
                  if (!bVar35) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_1340 = pBStack_1340 + -1;
                  lStack_12f8 = lStack_12f8 + 1;
                }
              }
              else {
                sVar29 = ZSTD_count(anchor_2 + 4,pBStack_1340 + 4,pBVar25);
                lStack_12f8 = sVar29 + 4;
                h2_2._4_4_ = iVar15 - (int)pBStack_1340;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex_2 < anchor_2 && pBVar24 < pBStack_1340) {
                    bVar35 = anchor_2[-1] == pBStack_1340[-1];
                  }
                  if (!bVar35) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_1340 = pBStack_1340 + -1;
                  lStack_12f8 = lStack_12f8 + 1;
                }
              }
            }
LAB_00ab6335:
            local_1288 = offsetSaved_2;
            offsetSaved_2 = h2_2._4_4_;
            uVar34 = (long)anchor_2 - (long)_prefixLowestIndex_2;
            if (pBVar25 + -0x20 < _prefixLowestIndex_2 + uVar34) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_prefixLowestIndex_2,_prefixLowestIndex_2 + uVar34,
                         pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_prefixLowestIndex_2);
              if (0x10 < uVar34) {
                pBVar33 = seqStore->lit;
                pBVar32 = pBVar33 + 0x10;
                ZSTD_copy16(pBVar32,_prefixLowestIndex_2 + 0x10);
                if (0x10 < (long)(uVar34 - 0x10)) {
                  oend_12 = pBVar33 + 0x20;
                  do {
                    op_12 = _prefixLowestIndex_2 + 0x20;
                    ZSTD_copy16(oend_12,op_12);
                    ZSTD_copy16(oend_12 + 0x10,_prefixLowestIndex_2 + 0x30);
                    oend_12 = oend_12 + 0x20;
                    _prefixLowestIndex_2 = op_12;
                  } while (oend_12 < pBVar32 + (uVar34 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar34;
            seqStore->sequences->offset = h2_2._4_4_ + 3;
            if (0xffff < lStack_12f8 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_12f8 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_00ab66e8;
          }
        }
        else {
          pBStack_1340 = pBVar11 + pUVar10[local_10e8];
          matchLong_2._4_4_ = pUVar10[local_10e8] + uVar17;
          if (pBVar27 < pBStack_1340) {
            UVar20 = MEM_read32(pBStack_1340);
            UVar21 = MEM_read32(anchor_2);
            if (UVar20 == UVar21) goto LAB_00ab5c32;
          }
        }
        anchor_2 = anchor_2 + ((long)anchor_2 - (long)_prefixLowestIndex_2 >> 8) + 1;
      }
      else {
        UVar20 = MEM_read32(local_1b68);
        UVar21 = MEM_read32(anchor_2 + 1);
        if (UVar20 != UVar21) goto LAB_00ab5886;
        local_1b78 = pBVar25;
        if (uVar19 < UVar16) {
          local_1b78 = pBVar12;
        }
        sVar29 = ZSTD_count_2segments(anchor_2 + 5,local_1b68 + 4,pBVar25,local_1b78,pBVar24);
        lStack_12f8 = sVar29 + 4;
        anchor_2 = anchor_2 + 1;
        uVar34 = (long)anchor_2 - (long)_prefixLowestIndex_2;
        if (pBVar25 + -0x20 < _prefixLowestIndex_2 + uVar34) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_2,_prefixLowestIndex_2 + uVar34,
                     pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_2);
          if (0x10 < uVar34) {
            pBVar33 = seqStore->lit;
            pBVar32 = pBVar33 + 0x10;
            ZSTD_copy16(pBVar32,_prefixLowestIndex_2 + 0x10);
            if (0x10 < (long)(uVar34 - 0x10)) {
              oend_10 = pBVar33 + 0x20;
              do {
                op_10 = _prefixLowestIndex_2 + 0x20;
                ZSTD_copy16(oend_10,op_10);
                ZSTD_copy16(oend_10 + 0x10,_prefixLowestIndex_2 + 0x30);
                oend_10 = oend_10 + 0x20;
                _prefixLowestIndex_2 = op_10;
              } while (oend_10 < pBVar32 + (uVar34 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar34;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00ab66e8:
        _prefixLowestIndex_2 = anchor_2 + lStack_12f8;
        anchor_2 = _prefixLowestIndex_2;
        if (_prefixLowestIndex_2 <= pBVar26) {
          uVar22 = UVar18 + 2;
          sVar29 = ZSTD_hash8Ptr(pBVar7 + uVar22,UVar1);
          pUVar5[sVar29] = uVar22;
          sVar29 = ZSTD_hash8Ptr(_prefixLowestIndex_2 + -2,UVar1);
          pUVar5[sVar29] = (int)(_prefixLowestIndex_2 + -2) - iVar14;
          pBVar33 = pBVar7 + uVar22;
          switch(0xab69fa) {
          case 0:
            local_1160 = ZSTD_hash4Ptr(pBVar33,UVar2);
            break;
          case 1:
            local_1160 = ZSTD_hash5Ptr(pBVar33,UVar2);
            break;
          case 2:
            local_1160 = ZSTD_hash6Ptr(pBVar33,UVar2);
            break;
          case 3:
            local_1160 = ZSTD_hash7Ptr(pBVar33,UVar2);
            break;
          case 4:
            local_1160 = ZSTD_hash8Ptr(pBVar33,UVar2);
          }
          pUVar6[local_1160] = uVar22;
          _prefixLowestIndex_2 = _prefixLowestIndex_2 + -1;
          switch(0xab6b0d) {
          case 0:
            local_1178 = ZSTD_hash4Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 1:
            local_1178 = ZSTD_hash5Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 2:
            local_1178 = ZSTD_hash6Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 3:
            local_1178 = ZSTD_hash7Ptr(_prefixLowestIndex_2,UVar2);
            break;
          case 4:
            local_1178 = ZSTD_hash8Ptr(_prefixLowestIndex_2,UVar2);
          }
          pUVar6[local_1178] = (int)_prefixLowestIndex_2 - iVar14;
          for (; UVar18 = local_1288, _prefixLowestIndex_2 = anchor_2, anchor_2 <= pBVar26;
              anchor_2 = anchor_2 + sVar29 + 4) {
            UVar20 = (int)anchor_2 - iVar14;
            uVar22 = UVar20 - local_1288;
            if (uVar22 < UVar16) {
              local_1c40 = pBVar11 + ((ulong)uVar22 - (ulong)uVar17);
            }
            else {
              local_1c40 = pBVar7 + uVar22;
            }
            if ((UVar16 - 1) - uVar22 < 3) break;
            UVar21 = MEM_read32(local_1c40);
            UVar23 = MEM_read32(anchor_2);
            if (UVar21 != UVar23) break;
            local_1c50 = pBVar25;
            if (uVar22 < UVar16) {
              local_1c50 = pBVar12;
            }
            sVar29 = ZSTD_count_2segments(anchor_2 + 4,local_1c40 + 4,pBVar25,local_1c50,pBVar24);
            local_1288 = offsetSaved_2;
            offsetSaved_2 = UVar18;
            if (pBVar25 + -0x20 < anchor_2) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_2,anchor_2,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_2);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_13._0_2_ = (U16)(sVar29 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_13;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0xab712f) {
            case 0:
              local_1190 = ZSTD_hash4Ptr(anchor_2,UVar2);
              break;
            case 1:
              local_1190 = ZSTD_hash5Ptr(anchor_2,UVar2);
              break;
            case 2:
              local_1190 = ZSTD_hash6Ptr(anchor_2,UVar2);
              break;
            case 3:
              local_1190 = ZSTD_hash7Ptr(anchor_2,UVar2);
              break;
            case 4:
              local_1190 = ZSTD_hash8Ptr(anchor_2,UVar2);
            }
            pUVar6[local_1190] = UVar20;
            sVar28 = ZSTD_hash8Ptr(anchor_2,UVar1);
            pUVar5[sVar28] = UVar20;
          }
        }
      }
      goto LAB_00ab4ada;
    }
    if (offsetSaved_2 == 0) {
      local_1cb8 = 0;
    }
    else {
      local_1cb8 = offsetSaved_2;
    }
    *rep = local_1cb8;
    if (local_1288 == 0) {
      local_1cbc = 0;
    }
    else {
      local_1cbc = local_1288;
    }
    rep[1] = local_1cbc;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_prefixLowestIndex_2);
    break;
  case 7:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar14 = (int)pBVar7;
    UVar16 = ZSTD_getLowestPrefixIndex(ms,(iVar13 - iVar14) + iVar15,(ms->cParams).windowLog);
    pBVar24 = pBVar7 + UVar16;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_3 = *rep;
    local_15d0 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar17 = UVar16 - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    anchor_3 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar13 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27) ==
                                        0));
    _prefixLowestIndex_3 = (BYTE *)src;
LAB_00ab7ee8:
    if (anchor_3 < pBVar26) {
      sVar29 = ZSTD_hash8Ptr(anchor_3,UVar1);
      switch(0xab808a) {
      case 0:
        local_1400 = ZSTD_hash4Ptr(anchor_3,UVar2);
        break;
      case 1:
        local_1400 = ZSTD_hash5Ptr(anchor_3,UVar2);
        break;
      case 2:
        local_1400 = ZSTD_hash6Ptr(anchor_3,UVar2);
        break;
      case 3:
        local_1400 = ZSTD_hash7Ptr(anchor_3,UVar2);
        break;
      case 4:
        local_1400 = ZSTD_hash8Ptr(anchor_3,UVar2);
      }
      sVar28 = ZSTD_hash8Ptr(anchor_3,UVar3);
      switch(0xab825a) {
      case 0:
        local_1430 = ZSTD_hash4Ptr(anchor_3,UVar4);
        break;
      case 1:
        local_1430 = ZSTD_hash5Ptr(anchor_3,UVar4);
        break;
      case 2:
        local_1430 = ZSTD_hash6Ptr(anchor_3,UVar4);
        break;
      case 3:
        local_1430 = ZSTD_hash7Ptr(anchor_3,UVar4);
        break;
      case 4:
        local_1430 = ZSTD_hash8Ptr(anchor_3,UVar4);
      }
      iVar15 = (int)anchor_3;
      UVar18 = iVar15 - iVar14;
      uVar22 = pUVar5[sVar29];
      matchLong_3._4_4_ = pUVar6[local_1400];
      match_3 = pBVar7 + uVar22;
      pBStack_1688 = pBVar7 + matchLong_3._4_4_;
      uVar19 = (UVar18 + 1) - offsetSaved_3;
      if (uVar19 < UVar16) {
        local_1d30 = pBVar11 + (uVar19 - uVar17);
      }
      else {
        local_1d30 = pBVar7 + uVar19;
      }
      pUVar6[local_1400] = UVar18;
      pUVar5[sVar29] = UVar18;
      if ((UVar16 - 1) - uVar19 < 3) {
LAB_00ab8c94:
        if (UVar16 < uVar22) {
          UVar30 = MEM_read64(match_3);
          UVar31 = MEM_read64(anchor_3);
          if (UVar30 != UVar31) goto LAB_00ab8f49;
          sVar29 = ZSTD_count(anchor_3 + 8,match_3 + 8,pBVar25);
          lStack_1640 = sVar29 + 8;
          h2_3._4_4_ = iVar15 - (int)match_3;
          while( true ) {
            bVar35 = false;
            if (_prefixLowestIndex_3 < anchor_3 && pBVar24 < match_3) {
              bVar35 = anchor_3[-1] == match_3[-1];
            }
            if (!bVar35) break;
            anchor_3 = anchor_3 + -1;
            match_3 = match_3 + -1;
            lStack_1640 = lStack_1640 + 1;
          }
          goto LAB_00ab9743;
        }
        uVar22 = pUVar9[sVar28];
        pBStack_16b0 = pBVar11 + uVar22;
        if (pBVar27 < pBStack_16b0) {
          UVar30 = MEM_read64(pBStack_16b0);
          UVar31 = MEM_read64(anchor_3);
          if (UVar30 == UVar31) {
            sVar29 = ZSTD_count_2segments(anchor_3 + 8,pBStack_16b0 + 8,pBVar25,pBVar12,pBVar24);
            lStack_1640 = sVar29 + 8;
            h2_3._4_4_ = (UVar18 - uVar22) - uVar17;
            while( true ) {
              bVar35 = false;
              if (_prefixLowestIndex_3 < anchor_3 && pBVar27 < pBStack_16b0) {
                bVar35 = anchor_3[-1] == pBStack_16b0[-1];
              }
              if (!bVar35) break;
              anchor_3 = anchor_3 + -1;
              pBStack_16b0 = pBStack_16b0 + -1;
              lStack_1640 = lStack_1640 + 1;
            }
            goto LAB_00ab9743;
          }
        }
LAB_00ab8f49:
        if (UVar16 < matchLong_3._4_4_) {
          UVar20 = MEM_read32(pBStack_1688);
          UVar21 = MEM_read32(anchor_3);
          if (UVar20 == UVar21) {
LAB_00ab9040:
            sVar29 = ZSTD_hash8Ptr(anchor_3 + 1,UVar1);
            sVar28 = ZSTD_hash8Ptr(anchor_3 + 1,UVar3);
            uVar22 = pUVar5[sVar29];
            pBStack_16d8 = pBVar7 + uVar22;
            pUVar5[sVar29] = UVar18 + 1;
            if (UVar16 < uVar22) {
              UVar30 = MEM_read64(pBStack_16d8);
              UVar31 = MEM_read64(anchor_3 + 1);
              if (UVar30 != UVar31) goto code_r0x00ab9551;
              sVar29 = ZSTD_count(anchor_3 + 9,pBStack_16d8 + 8,pBVar25);
              lStack_1640 = sVar29 + 8;
              anchor_3 = anchor_3 + 1;
              h2_3._4_4_ = (int)anchor_3 - (int)pBStack_16d8;
              while( true ) {
                bVar35 = false;
                if (_prefixLowestIndex_3 < anchor_3 && pBVar24 < pBStack_16d8) {
                  bVar35 = anchor_3[-1] == pBStack_16d8[-1];
                }
                if (!bVar35) break;
                anchor_3 = anchor_3 + -1;
                pBStack_16d8 = pBStack_16d8 + -1;
                lStack_1640 = lStack_1640 + 1;
              }
            }
            else {
              uVar22 = pUVar9[sVar28];
              _current2_3 = pBVar11 + uVar22;
              if (pBVar27 < _current2_3) {
                UVar30 = MEM_read64(_current2_3);
                UVar31 = MEM_read64(anchor_3 + 1);
                if (UVar30 == UVar31) {
                  sVar29 = ZSTD_count_2segments
                                     (anchor_3 + 9,_current2_3 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_1640 = sVar29 + 8;
                  anchor_3 = anchor_3 + 1;
                  h2_3._4_4_ = ((UVar18 + 1) - uVar22) - uVar17;
                  while( true ) {
                    bVar35 = false;
                    if (_prefixLowestIndex_3 < anchor_3 && pBVar27 < _current2_3) {
                      bVar35 = anchor_3[-1] == _current2_3[-1];
                    }
                    if (!bVar35) break;
                    anchor_3 = anchor_3 + -1;
                    _current2_3 = _current2_3 + -1;
                    lStack_1640 = lStack_1640 + 1;
                  }
                  goto LAB_00ab9743;
                }
              }
code_r0x00ab9551:
              if (matchLong_3._4_4_ < UVar16) {
                sVar29 = ZSTD_count_2segments(anchor_3 + 4,pBStack_1688 + 4,pBVar25,pBVar12,pBVar24)
                ;
                lStack_1640 = sVar29 + 4;
                h2_3._4_4_ = UVar18 - matchLong_3._4_4_;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex_3 < anchor_3 && pBVar27 < pBStack_1688) {
                    bVar35 = anchor_3[-1] == pBStack_1688[-1];
                  }
                  if (!bVar35) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_1688 = pBStack_1688 + -1;
                  lStack_1640 = lStack_1640 + 1;
                }
              }
              else {
                sVar29 = ZSTD_count(anchor_3 + 4,pBStack_1688 + 4,pBVar25);
                lStack_1640 = sVar29 + 4;
                h2_3._4_4_ = iVar15 - (int)pBStack_1688;
                while( true ) {
                  bVar35 = false;
                  if (_prefixLowestIndex_3 < anchor_3 && pBVar24 < pBStack_1688) {
                    bVar35 = anchor_3[-1] == pBStack_1688[-1];
                  }
                  if (!bVar35) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_1688 = pBStack_1688 + -1;
                  lStack_1640 = lStack_1640 + 1;
                }
              }
            }
LAB_00ab9743:
            local_15d0 = offsetSaved_3;
            offsetSaved_3 = h2_3._4_4_;
            uVar34 = (long)anchor_3 - (long)_prefixLowestIndex_3;
            if (pBVar25 + -0x20 < _prefixLowestIndex_3 + uVar34) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_prefixLowestIndex_3,_prefixLowestIndex_3 + uVar34,
                         pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_prefixLowestIndex_3);
              if (0x10 < uVar34) {
                pBVar33 = seqStore->lit;
                pBVar32 = pBVar33 + 0x10;
                ZSTD_copy16(pBVar32,_prefixLowestIndex_3 + 0x10);
                if (0x10 < (long)(uVar34 - 0x10)) {
                  oend_17 = pBVar33 + 0x20;
                  do {
                    op_17 = _prefixLowestIndex_3 + 0x20;
                    ZSTD_copy16(oend_17,op_17);
                    ZSTD_copy16(oend_17 + 0x10,_prefixLowestIndex_3 + 0x30);
                    oend_17 = oend_17 + 0x20;
                    _prefixLowestIndex_3 = op_17;
                  } while (oend_17 < pBVar32 + (uVar34 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar34;
            seqStore->sequences->offset = h2_3._4_4_ + 3;
            if (0xffff < lStack_1640 - 3U) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_1640 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_00ab9af6;
          }
        }
        else {
          pBStack_1688 = pBVar11 + pUVar10[local_1430];
          matchLong_3._4_4_ = pUVar10[local_1430] + uVar17;
          if (pBVar27 < pBStack_1688) {
            UVar20 = MEM_read32(pBStack_1688);
            UVar21 = MEM_read32(anchor_3);
            if (UVar20 == UVar21) goto LAB_00ab9040;
          }
        }
        anchor_3 = anchor_3 + ((long)anchor_3 - (long)_prefixLowestIndex_3 >> 8) + 1;
      }
      else {
        UVar20 = MEM_read32(local_1d30);
        UVar21 = MEM_read32(anchor_3 + 1);
        if (UVar20 != UVar21) goto LAB_00ab8c94;
        local_1d40 = pBVar25;
        if (uVar19 < UVar16) {
          local_1d40 = pBVar12;
        }
        sVar29 = ZSTD_count_2segments(anchor_3 + 5,local_1d30 + 4,pBVar25,local_1d40,pBVar24);
        lStack_1640 = sVar29 + 4;
        anchor_3 = anchor_3 + 1;
        uVar34 = (long)anchor_3 - (long)_prefixLowestIndex_3;
        if (pBVar25 + -0x20 < _prefixLowestIndex_3 + uVar34) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_prefixLowestIndex_3,_prefixLowestIndex_3 + uVar34,
                     pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_prefixLowestIndex_3);
          if (0x10 < uVar34) {
            pBVar33 = seqStore->lit;
            pBVar32 = pBVar33 + 0x10;
            ZSTD_copy16(pBVar32,_prefixLowestIndex_3 + 0x10);
            if (0x10 < (long)(uVar34 - 0x10)) {
              oend_15 = pBVar33 + 0x20;
              do {
                op_15 = _prefixLowestIndex_3 + 0x20;
                ZSTD_copy16(oend_15,op_15);
                ZSTD_copy16(oend_15 + 0x10,_prefixLowestIndex_3 + 0x30);
                oend_15 = oend_15 + 0x20;
                _prefixLowestIndex_3 = op_15;
              } while (oend_15 < pBVar32 + (uVar34 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar34;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00ab9af6:
        _prefixLowestIndex_3 = anchor_3 + lStack_1640;
        anchor_3 = _prefixLowestIndex_3;
        if (_prefixLowestIndex_3 <= pBVar26) {
          uVar22 = UVar18 + 2;
          sVar29 = ZSTD_hash8Ptr(pBVar7 + uVar22,UVar1);
          pUVar5[sVar29] = uVar22;
          sVar29 = ZSTD_hash8Ptr(_prefixLowestIndex_3 + -2,UVar1);
          pUVar5[sVar29] = (int)(_prefixLowestIndex_3 + -2) - iVar14;
          pBVar33 = pBVar7 + uVar22;
          switch(0xab9e23) {
          case 0:
            local_14a8 = ZSTD_hash4Ptr(pBVar33,UVar2);
            break;
          case 1:
            local_14a8 = ZSTD_hash5Ptr(pBVar33,UVar2);
            break;
          case 2:
            local_14a8 = ZSTD_hash6Ptr(pBVar33,UVar2);
            break;
          case 3:
            local_14a8 = ZSTD_hash7Ptr(pBVar33,UVar2);
            break;
          case 4:
            local_14a8 = ZSTD_hash8Ptr(pBVar33,UVar2);
          }
          pUVar6[local_14a8] = uVar22;
          _prefixLowestIndex_3 = _prefixLowestIndex_3 + -1;
          switch(0xab9f36) {
          case 0:
            local_14c0 = ZSTD_hash4Ptr(_prefixLowestIndex_3,UVar2);
            break;
          case 1:
            local_14c0 = ZSTD_hash5Ptr(_prefixLowestIndex_3,UVar2);
            break;
          case 2:
            local_14c0 = ZSTD_hash6Ptr(_prefixLowestIndex_3,UVar2);
            break;
          case 3:
            local_14c0 = ZSTD_hash7Ptr(_prefixLowestIndex_3,UVar2);
            break;
          case 4:
            local_14c0 = ZSTD_hash8Ptr(_prefixLowestIndex_3,UVar2);
          }
          pUVar6[local_14c0] = (int)_prefixLowestIndex_3 - iVar14;
          for (; UVar18 = local_15d0, _prefixLowestIndex_3 = anchor_3, anchor_3 <= pBVar26;
              anchor_3 = anchor_3 + sVar29 + 4) {
            UVar20 = (int)anchor_3 - iVar14;
            uVar22 = UVar20 - local_15d0;
            if (uVar22 < UVar16) {
              local_1e08 = pBVar11 + ((ulong)uVar22 - (ulong)uVar17);
            }
            else {
              local_1e08 = pBVar7 + uVar22;
            }
            if ((UVar16 - 1) - uVar22 < 3) break;
            UVar21 = MEM_read32(local_1e08);
            UVar23 = MEM_read32(anchor_3);
            if (UVar21 != UVar23) break;
            local_1e18 = pBVar25;
            if (uVar22 < UVar16) {
              local_1e18 = pBVar12;
            }
            sVar29 = ZSTD_count_2segments(anchor_3 + 4,local_1e08 + 4,pBVar25,local_1e18,pBVar24);
            local_15d0 = offsetSaved_3;
            offsetSaved_3 = UVar18;
            if (pBVar25 + -0x20 < anchor_3) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_3,anchor_3,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_3);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            litLimit_w_18._0_2_ = (U16)(sVar29 + 1);
            seqStore->sequences->matchLength = (U16)litLimit_w_18;
            seqStore->sequences = seqStore->sequences + 1;
            switch(0xaba558) {
            case 0:
              local_14d8 = ZSTD_hash4Ptr(anchor_3,UVar2);
              break;
            case 1:
              local_14d8 = ZSTD_hash5Ptr(anchor_3,UVar2);
              break;
            case 2:
              local_14d8 = ZSTD_hash6Ptr(anchor_3,UVar2);
              break;
            case 3:
              local_14d8 = ZSTD_hash7Ptr(anchor_3,UVar2);
              break;
            case 4:
              local_14d8 = ZSTD_hash8Ptr(anchor_3,UVar2);
            }
            pUVar6[local_14d8] = UVar20;
            sVar28 = ZSTD_hash8Ptr(anchor_3,UVar1);
            pUVar5[sVar28] = UVar20;
          }
        }
      }
      goto LAB_00ab7ee8;
    }
    if (offsetSaved_3 == 0) {
      local_1e80 = 0;
    }
    else {
      local_1e80 = offsetSaved_3;
    }
    *rep = local_1e80;
    if (local_15d0 == 0) {
      local_1e84 = 0;
    }
    else {
      local_1e84 = local_15d0;
    }
    rep[1] = local_1e84;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_prefixLowestIndex_3);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}